

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O2

ZyanStatus
ZydisFormatterATTFormatOperandMEM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanU8 ZVar1;
  ZydisRegister ZVar2;
  ZydisRegister ZVar3;
  ZydisDecodedOperand *pZVar4;
  ZyanStatus ZVar5;
  ZyanStatus ZVar6;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcb,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcc,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcd,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar5 = (*formatter->func_print_segment)(formatter,buffer,context);
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  if (((((formatter->force_relative_riprel == '\0') &&
        (context->runtime_address != 0xffffffffffffffff)) &&
       (pZVar4 = context->operand, *(char *)((long)&pZVar4->field_10 + 0x21) != '\0')) &&
      ((pZVar4->field_10).mem.index == ZYDIS_REGISTER_NONE)) &&
     ((ZVar2 = (pZVar4->field_10).mem.base, ZVar2 - ZYDIS_REGISTER_EIP < 2 ||
      (ZVar2 == ZYDIS_REGISTER_NONE)))) {
LAB_00115964:
    ZVar6 = (*formatter->func_print_address_abs)(formatter,buffer,context);
    ZVar5 = 0x100000;
    if ((int)ZVar6 < 0) {
      ZVar5 = ZVar6;
    }
    return ZVar5;
  }
  pZVar4 = context->operand;
  ZVar2 = (pZVar4->field_10).mem.base;
  ZVar3 = (pZVar4->field_10).mem.index;
  if (ZVar2 == ZYDIS_REGISTER_NONE && ZVar3 == ZYDIS_REGISTER_NONE) goto LAB_00115964;
  if (((*(char *)((long)&pZVar4->field_10 + 0x21) != '\0') &&
      ((pZVar4->field_10).mem.disp.value != 0)) &&
     (ZVar5 = (*formatter->func_print_disp)(formatter,buffer,context), (int)ZVar5 < 0)) {
    return ZVar5;
  }
  if (buffer->is_token_list == '\0') {
    ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_BEGIN_ATT);
  }
  else {
    ZVar5 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_BEGIN_ATT);
  }
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  if ((ZVar2 != ZYDIS_REGISTER_NONE) &&
     (ZVar5 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->operand->field_10).mem.base),
     (int)ZVar5 < 0)) {
    return ZVar5;
  }
  if (ZVar3 == ZYDIS_REGISTER_NONE) goto LAB_00115a90;
  if (buffer->is_token_list == '\0') {
    ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MEMORY);
  }
  else {
    ZVar5 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MEMORY);
  }
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  ZVar5 = (*formatter->func_print_register)
                    (formatter,buffer,context,(context->operand->field_10).mem.index);
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  ZVar1 = (context->operand->field_10).mem.scale;
  if (((ZVar1 == '\0') || ((context->operand->field_10).mem.type == ZYDIS_MEMOP_TYPE_MIB)) ||
     ((ZVar1 == '\x01' && (formatter->force_memory_scale == '\0')))) goto LAB_00115a90;
  if (buffer->is_token_list == '\0') {
LAB_00115b00:
    ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MEMORY);
  }
  else {
    ZVar5 = ZydisFormatterBufferAppend(buffer,'\x02');
    if ((int)ZVar5 < 0) {
      return ZVar5;
    }
    if (buffer->is_token_list == '\0') goto LAB_00115b00;
    ZVar5 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MEMORY);
  }
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar5 = ZydisFormatterBufferAppend(buffer,'\v'), (int)ZVar5 < 0)) {
    return ZVar5;
  }
  ZVar5 = ZydisStringAppendDecU
                    (&buffer->string,(ulong)(context->operand->field_10).mem.scale,'\0',
                     (ZyanStringView *)0x0,(ZyanStringView *)0x0);
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
LAB_00115a90:
  if (buffer->is_token_list == '\0') {
    ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_END_ATT);
  }
  else {
    ZVar5 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_END_ATT);
  }
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYAN_CHECK(formatter->func_print_segment(formatter, buffer, context));

    const ZyanBool absolute = !formatter->force_relative_riprel &&
        (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
    if (absolute && context->operand->mem.disp.size &&
        (context->operand->mem.index == ZYDIS_REGISTER_NONE) &&
       ((context->operand->mem.base  == ZYDIS_REGISTER_NONE) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_EIP ) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_RIP )))
    {
        // EIP/RIP-relative or absolute-displacement address operand
        ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
    } else
    {
        const ZyanBool should_print_reg = context->operand->mem.base != ZYDIS_REGISTER_NONE;
        const ZyanBool should_print_idx = context->operand->mem.index != ZYDIS_REGISTER_NONE;
        const ZyanBool neither_reg_nor_idx = !should_print_reg && !should_print_idx;

        // Regular memory operand
        if (neither_reg_nor_idx)
        {
            ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
        } else if (context->operand->mem.disp.size && context->operand->mem.disp.value)
        {
            ZYAN_CHECK(formatter->func_print_disp(formatter, buffer, context));
        }

        if (neither_reg_nor_idx)
        {
            return ZYAN_STATUS_SUCCESS;
        }

        ZYDIS_BUFFER_APPEND(buffer, MEMORY_BEGIN_ATT);

        if (should_print_reg)
        {
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.base));
        }
        if (should_print_idx)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MEMORY);
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.index));
            if (context->operand->mem.scale &&
                (context->operand->mem.type != ZYDIS_MEMOP_TYPE_MIB) &&
                ((context->operand->mem.scale > 1) || formatter->force_memory_scale))
            {
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DELIMITER);
                ZYDIS_BUFFER_APPEND(buffer, DELIM_MEMORY);
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
                ZYAN_CHECK(ZydisStringAppendDecU(&buffer->string, context->operand->mem.scale, 0,
                    ZYAN_NULL, ZYAN_NULL));
            }
        }

        ZYDIS_BUFFER_APPEND(buffer, MEMORY_END_ATT);
        return ZYAN_STATUS_SUCCESS;
    }

    return ZYAN_STATUS_SUCCESS;
}